

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeLoop
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name label,Signature sig)

{
  Loop *loop_00;
  Loop *loop;
  IRBuilder *this_local;
  Signature sig_local;
  Name label_local;
  
  sig_local.results.id = label.super_IString.str._M_len;
  sig_local.params = sig.results.id;
  loop_00 = MixedArena::alloc<wasm::Loop>(&this->wasm->allocator);
  wasm::Name::operator=(&loop_00->name,(Name *)&sig_local.results);
  (loop_00->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id =
       sig_local.params.id;
  visitLoopStart(__return_storage_ptr__,this,loop_00,sig.params.id);
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeLoop(Name label, Signature sig) {
  auto* loop = wasm.allocator.alloc<Loop>();
  loop->name = label;
  loop->type = sig.results;
  return visitLoopStart(loop, sig.params);
}